

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBox.cpp
# Opt level: O1

void __thiscall chrono::geometry::ChBox::ArchiveIN(ChBox *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  ChVector<double> Lengths;
  undefined **local_58;
  double *local_50;
  double local_48;
  double dStack_40;
  double local_38;
  char *local_30;
  undefined1 *local_28;
  undefined1 local_20;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChBox>(marchive);
  ChVolume::ArchiveIN(&this->super_ChVolume,marchive);
  local_50 = &local_48;
  local_48 = 0.0;
  dStack_40 = 0.0;
  local_38 = 0.0;
  local_58 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_30 = "Lengths";
  local_20 = 0;
  local_28 = (undefined1 *)&local_58;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  (this->Size).m_data[0] = local_48 * 0.5;
  (this->Size).m_data[1] = dStack_40 * 0.5;
  (this->Size).m_data[2] = local_38 * 0.5;
  return;
}

Assistant:

void ChBox::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChBox>();
    // deserialize parent class
    ChVolume::ArchiveIN(marchive);
    // stream in all member data:
    ChVector<> Lengths;
    marchive >> CHNVP(Lengths);  // avoid storing 'Size', i.e. half lengths, because less intuitive
    SetLengths(Lengths);
}